

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eqclass.cc
# Opt level: O1

void __thiscall Eqclass::Eqclass(Eqclass *this,int iset_sz,int eqt)

{
  Lists<std::shared_ptr<Itemset>_> *pLVar1;
  
  (this->theList).super___shared_ptr<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->theList).super___shared_ptr<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->theList2).super___shared_ptr<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->theList2).super___shared_ptr<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->Iset_size = iset_sz;
  this->Eqtype = eqt;
  pLVar1 = (Lists<std::shared_ptr<Itemset>_> *)operator_new(0x28);
  Lists<std::shared_ptr<Itemset>_>::Lists(pLVar1);
  std::__shared_ptr<Lists<std::shared_ptr<Itemset>>,(__gnu_cxx::_Lock_policy)2>::
  reset<Lists<std::shared_ptr<Itemset>>>
            ((__shared_ptr<Lists<std::shared_ptr<Itemset>>,(__gnu_cxx::_Lock_policy)2> *)this,pLVar1
            );
  this->seqTemplate2 = 0;
  this->seqTemplate = 0;
  if (this->Eqtype == 1) {
    pLVar1 = (Lists<std::shared_ptr<Itemset>_> *)operator_new(0x28);
    Lists<std::shared_ptr<Itemset>_>::Lists(pLVar1);
    std::__shared_ptr<Lists<std::shared_ptr<Itemset>>,(__gnu_cxx::_Lock_policy)2>::
    reset<Lists<std::shared_ptr<Itemset>>>
              ((__shared_ptr<Lists<std::shared_ptr<Itemset>>,(__gnu_cxx::_Lock_policy)2> *)
               &this->theList2,pLVar1);
  }
  return;
}

Assistant:

Eqclass::Eqclass(int iset_sz, int eqt) {
    Iset_size = iset_sz;
    Eqtype = eqt;
    theList.reset(new Lists<shared_ptr<Itemset>>());
    seqTemplate = seqTemplate2 = 0;

    if (Eqtype == EQCTYP1) {
        theList2.reset(new Lists<shared_ptr<Itemset>>());
    }
}